

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DIS_Logger_Playback.cpp
# Opt level: O1

KBOOL __thiscall KDIS::UTILS::DIS_Logger_Playback::EndOfLogReached(DIS_Logger_Playback *this)

{
  _Map_pointer ppLVar1;
  KBOOL KVar2;
  
  if ((((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 2) == 0) ||
     (ppLVar1 = (this->m_qLog).c.
                super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node, KVar2 = true,
     ((long)(this->m_qLog).c.
            super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
            ._M_impl.super__Deque_impl_data._M_start._M_last -
      (long)(this->m_qLog).c.
            super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 6) +
     ((long)(this->m_qLog).c.
            super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
      (long)(this->m_qLog).c.
            super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 6) +
     ((long)ppLVar1 +
      ((ulong)(ppLVar1 != (_Map_pointer)0x0) * -8 -
      (long)(this->m_qLog).c.
            super__Deque_base<KDIS::UTILS::DIS_Logger_Playback::Log,_std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node) & 0xfffffffffffffff8) != 0)) {
    KVar2 = false;
  }
  return KVar2;
}

Assistant:

KBOOL DIS_Logger_Playback::EndOfLogReached() const
{
    if( m_File.eof() && m_qLog.size() == 0 )return true;
    return false;
}